

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O1

int __thiscall AES256CBCEncrypt::Encrypt(AES256CBCEncrypt *this,uchar *data,int size,uchar *out)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  int i;
  long lVar4;
  uchar *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->pad;
  uVar6 = size % 0x10;
  uVar8 = 0;
  if (((uVar6 == 0 | bVar1) & (out != (uchar *)0x0 && (data != (uchar *)0x0 && size != 0))) == 1) {
    local_48 = *(undefined8 *)this->iv;
    uStack_40 = *(undefined8 *)(this->iv + 8);
    if (size < 0x10) {
      uVar7 = 0x10;
      uVar8 = 0;
    }
    else {
      lVar3 = 0;
      uVar7 = 0x10;
      do {
        uVar8 = uVar7;
        puVar5 = data;
        lVar4 = 0;
        do {
          *(byte *)((long)&local_48 + lVar4) = *(byte *)((long)&local_48 + lVar4) ^ puVar5[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        AES_encrypt((uchar *)this,(uchar *)0xe,(AES_KEY *)(out + lVar3));
        local_48 = *(undefined8 *)(out + lVar3);
        uStack_40 = *(undefined8 *)(out + lVar3 + 8);
        uVar7 = uVar8 + 0x10;
        lVar3 = lVar3 + 0x10;
        data = puVar5 + 0x10;
      } while ((int)uVar7 <= size);
      data = puVar5 + 0x10;
    }
    if (bVar1 != false) {
      if (uVar6 != 0) {
        uVar2 = 0;
        do {
          *(byte *)((long)&local_48 + uVar2) = *(byte *)((long)&local_48 + uVar2) ^ data[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar6 != uVar2);
      }
      lVar3 = (long)(int)uVar6;
      do {
        *(byte *)((long)&local_48 + lVar3) =
             *(byte *)((long)&local_48 + lVar3) ^ 0x10U - (char)uVar6;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      AES_encrypt((uchar *)this,(uchar *)0xe,(AES_KEY *)(out + uVar8));
      uVar8 = uVar7;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar8;
  }
  __stack_chk_fail();
}

Assistant:

int AES256CBCEncrypt::Encrypt(const unsigned char* data, int size, unsigned char* out) const
{
    return CBCEncrypt(enc, iv, data, size, pad, out);
}